

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O1

REF_STATUS
ref_metric_buffer_at_complexity(REF_DBL *metric,REF_GRID ref_grid,REF_DBL target_complexity)

{
  REF_NODE pRVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  REF_DBL *pRVar6;
  double dVar7;
  REF_DBL RVar8;
  REF_DBL current_complexity;
  double local_60;
  REF_DBL local_58;
  REF_DBL local_48;
  
  pRVar1 = ref_grid->node;
  local_48 = target_complexity;
  if (target_complexity <= -target_complexity) {
    local_48 = -target_complexity;
  }
  iVar4 = 0;
  local_58 = target_complexity;
  do {
    uVar2 = ref_metric_buffer(metric,ref_grid);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x8b1,"ref_metric_buffer_at_complexity",(ulong)uVar2,"buffer");
      return uVar2;
    }
    uVar2 = ref_metric_complexity(metric,ref_grid,&local_60);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x8b2,"ref_metric_buffer_at_complexity",(ulong)uVar2,"cmp");
      return uVar2;
    }
    dVar7 = local_60 * 1e+20;
    if (dVar7 <= -dVar7) {
      dVar7 = -dVar7;
    }
    if (dVar7 <= local_48) {
      return 4;
    }
    if (0 < pRVar1->max) {
      lVar5 = 0;
      pRVar6 = metric;
      RVar8 = local_58;
      do {
        if (-1 < pRVar1->global[lVar5]) {
          lVar3 = 0;
          do {
            dVar7 = pow(RVar8 / local_60,0.6666666666666666);
            pRVar6[lVar3] = dVar7 * pRVar6[lVar3];
            lVar3 = lVar3 + 1;
            RVar8 = local_58;
          } while (lVar3 != 6);
        }
        lVar5 = lVar5 + 1;
        pRVar6 = pRVar6 + 6;
      } while (lVar5 < pRVar1->max);
    }
    iVar4 = iVar4 + 1;
  } while (iVar4 != 10);
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_metric_buffer_at_complexity(REF_DBL *metric,
                                                   REF_GRID ref_grid,
                                                   REF_DBL target_complexity) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT i, node, relaxations;
  REF_DBL current_complexity;

  /* global scaling and buffer */
  for (relaxations = 0; relaxations < 10; relaxations++) {
    RSS(ref_metric_buffer(metric, ref_grid), "buffer");
    RSS(ref_metric_complexity(metric, ref_grid, &current_complexity), "cmp");
    if (!ref_math_divisible(target_complexity, current_complexity)) {
      return REF_DIV_ZERO;
    }
    each_ref_node_valid_node(ref_node, node) for (i = 0; i < 6; i++) {
      metric[i + 6 * node] *=
          pow(target_complexity / current_complexity, 2.0 / 3.0);
    }
  }

  return REF_SUCCESS;
}